

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeArray(ExpressionContext *ctx,SynArray *syntax)

{
  TypeBase *type;
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  TypeBase *pTVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  ExprBase *pEVar9;
  TypeBase *pTVar10;
  TypeUnsizedArray *type_00;
  ExprError *value;
  undefined4 extraout_var;
  TypeBase *pTVar11;
  ExprBase *pEVar12;
  TypeArray *pTVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar14;
  SynBase *pSVar15;
  ulong uVar16;
  IntrusiveList<ExprBase> values;
  SmallArray<ExprBase_*,_64U> raw;
  ExprError *node;
  undefined4 extraout_var_00;
  
  if ((syntax->values).head == (SynBase *)0x0) {
    __assert_fail("syntax->values.head",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xf28,"ExprBase *AnalyzeArray(ExpressionContext &, SynArray *)");
  }
  raw.allocator = ctx->allocator;
  raw.data = raw.little;
  raw.count = 0;
  raw.max = 0x40;
  pSVar15 = (syntax->values).head;
  type_00 = (TypeUnsizedArray *)0x0;
  if (pSVar15 != (SynBase *)0x0) {
    do {
      pEVar9 = AnalyzeExpression(ctx,pSVar15);
      if ((raw.count != 0) && (pTVar10 = (*raw.data)->type, pTVar10 != pEVar9->type)) {
        if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0x13)) {
          pTVar10 = (TypeBase *)0x0;
        }
        if (pTVar10 != (TypeBase *)0x0) {
          type_00 = ExpressionContext::GetUnsizedArrayType
                              (ctx,(TypeBase *)pTVar10[1]._vptr_TypeBase);
        }
      }
      if (raw.count == raw.max) {
        SmallArray<ExprBase_*,_64U>::grow(&raw,raw.count);
      }
      if (raw.data == (ExprBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ExprBase *, 64>::push_back(const T &) [T = ExprBase *, N = 64]"
                     );
      }
      uVar16 = raw._8_8_ & 0xffffffff;
      raw.count = raw.count + 1;
      raw.data[uVar16] = pEVar9;
      pSVar15 = pSVar15->next;
    } while (pSVar15 != (SynBase *)0x0);
  }
  if (((raw.count == 0) || ((*raw.data)->type == (TypeBase *)0x0)) ||
     ((*raw.data)->type->typeID != 0)) {
    values.head = (ExprBase *)0x0;
    values.tail = (ExprBase *)0x0;
    if (raw.count == 0) {
      pTVar10 = (TypeBase *)0x0;
    }
    else {
      uVar16 = 0;
      pTVar11 = (TypeBase *)0x0;
      do {
        value = (ExprError *)raw.data[uVar16];
        if (type_00 != (TypeUnsizedArray *)0x0) {
          value = (ExprError *)
                  CreateCast(ctx,(value->super_ExprBase).source,(ExprBase *)value,
                             (TypeBase *)type_00,false);
        }
        type = (value->super_ExprBase).type;
        pTVar10 = type;
        if ((pTVar11 != (TypeBase *)0x0) && (pTVar10 = pTVar11, pTVar11 != type)) {
          pTVar1 = ctx->typeBool;
          pTVar2 = ctx->typeChar;
          pTVar3 = ctx->typeShort;
          pTVar4 = ctx->typeInt;
          if (((((pTVar4 != type && pTVar3 != type) && (pTVar2 != type && pTVar1 != type)) &&
               (ctx->typeLong != type)) ||
              ((ctx->typeFloat != pTVar11 && (ctx->typeDouble != pTVar11)))) &&
             ((((pTVar4 != type && pTVar3 != type) && (pTVar2 != type && pTVar1 != type)) &&
               ctx->typeLong != type ||
              (((((pTVar1 != pTVar11 && (pTVar2 != pTVar11)) && (pTVar3 != pTVar11)) &&
                ((pTVar4 != pTVar11 && (ctx->typeLong != pTVar11)))) ||
               (pTVar11->size <= type->size)))))) {
            if (((ctx->typeDouble != type && ctx->typeFloat != type) ||
                (ctx->typeDouble != pTVar11 && ctx->typeFloat != pTVar11)) ||
               (pTVar11->size <= type->size)) {
              if ((type == (TypeBase *)0x0) || (type->typeID != 0)) {
                pcVar5 = (type->name).begin;
                pcVar6 = (pTVar11->name).begin;
                value = anon_unknown.dwarf_9fd58::ReportExpected
                                  (ctx,(value->super_ExprBase).source,type,
                                   "ERROR: array element %d type \'%.*s\' doesn\'t match \'%.*s\'",
                                   (ulong)((int)uVar16 + 1),
                                   (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar5),pcVar5,
                                   (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)pcVar6),pcVar6)
                ;
              }
              goto LAB_0015b2b8;
            }
          }
          value = (ExprError *)
                  CreateCast(ctx,(value->super_ExprBase).source,&value->super_ExprBase,pTVar11,false
                            );
        }
LAB_0015b2b8:
        pSVar15 = (value->super_ExprBase).source;
        if ((value->super_ExprBase).type == ctx->typeVoid) {
          anon_unknown.dwarf_9fd58::Stop
                    (ctx,pSVar15,"ERROR: array cannot be constructed from void type elements");
        }
        bVar7 = AssertValueExpression(ctx,pSVar15,&value->super_ExprBase);
        node = value;
        if (!bVar7) {
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          node = (ExprError *)CONCAT44(extraout_var,iVar8);
          pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          (node->super_ExprBase).typeID = 0;
          (node->super_ExprBase).source = &syntax->super_SynBase;
          (node->super_ExprBase).type = pTVar11;
          (node->super_ExprBase).next = (ExprBase *)0x0;
          (node->super_ExprBase).listed = false;
          (node->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00229b38;
          (node->values).allocator = (Allocator *)0x0;
          (node->values).data = (node->values).little;
          (node->values).count = 1;
          (node->values).max = 4;
          (node->values).little[0] = &value->super_ExprBase;
        }
        IntrusiveList<ExprBase>::push_back(&values,&node->super_ExprBase);
        uVar16 = uVar16 + 1;
        pTVar11 = pTVar10;
      } while (uVar16 < (raw._8_8_ & 0xffffffff));
    }
    if (((values.head == (ExprBase *)0x0) || ((values.head)->type == (TypeBase *)0x0)) ||
       ((values.head)->type->typeID != 0)) {
      if ((pTVar10 == (TypeBase *)0x0) || (pTVar11 = pTVar10, pTVar10->typeID != 0x18)) {
        pTVar11 = (TypeBase *)0x0;
      }
      if ((pTVar11 != (TypeBase *)0x0) &&
         (*(char *)((long)&pTVar11[3]._vptr_TypeBase + 2) == '\x01')) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,&syntax->super_SynBase,
                   "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
                   ,(ulong)(uint)(*(int *)&(pTVar10->name).end - (int)(pTVar10->name).begin));
      }
      if (0xffff < pTVar10->size) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: array element size cannot exceed 65535 bytes")
        ;
      }
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar12 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
      uVar16 = 0;
      pEVar9 = values.head;
      if (values.head != (ExprBase *)0x0) {
        do {
          uVar14 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar14;
          pEVar9 = pEVar9->next;
        } while (pEVar9 != (ExprBase *)0x0);
        uVar16 = (ulong)uVar14;
      }
      pTVar13 = ExpressionContext::GetArrayType(ctx,pTVar10,uVar16);
    }
    else {
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar12 = (ExprBase *)CONCAT44(extraout_var_02,iVar8);
      pTVar13 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
    }
    pEVar12->typeID = 0xf;
    pEVar12->source = &syntax->super_SynBase;
  }
  else {
    values.head = (ExprBase *)0x0;
    values.tail = (ExprBase *)0x0;
    if (raw.count != 0) {
      uVar16 = 0;
      do {
        IntrusiveList<ExprBase>::push_back(&values,raw.data[uVar16]);
        uVar16 = uVar16 + 1;
      } while (uVar16 < (raw._8_8_ & 0xffffffff));
    }
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar12 = (ExprBase *)CONCAT44(extraout_var_01,iVar8);
    pTVar13 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
    pEVar12->typeID = 0xf;
    pEVar12->source = &syntax->super_SynBase;
  }
  pEVar12->type = &pTVar13->super_TypeBase;
  pEVar12->next = (ExprBase *)0x0;
  pEVar12->listed = false;
  pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229c18;
  *(undefined4 *)&pEVar12[1]._vptr_ExprBase = values.head._0_4_;
  *(undefined4 *)((long)&pEVar12[1]._vptr_ExprBase + 4) = values.head._4_4_;
  pEVar12[1].typeID = (uint)values.tail;
  *(undefined4 *)&pEVar12[1].field_0xc = values.tail._4_4_;
  SmallArray<ExprBase_*,_64U>::~SmallArray(&raw);
  return pEVar12;
}

Assistant:

ExprBase* AnalyzeArray(ExpressionContext &ctx, SynArray *syntax)
{
	assert(syntax->values.head);

	SmallArray<ExprBase*, 64> raw(ctx.allocator);

	TypeBase *nestedUnsizedType = NULL;

	for(SynBase *el = syntax->values.head; el; el = el->next)
	{
		ExprBase *value = AnalyzeExpression(ctx, el);

		if(!raw.empty() && raw[0]->type != value->type)
		{
			if(TypeArray *arrayType = getType<TypeArray>(raw[0]->type))
				nestedUnsizedType = ctx.GetUnsizedArrayType(arrayType->subType);
		}

		raw.push_back(value);
	}

	// First value type is required to complete array definition
	if(!raw.empty() && isType<TypeError>(raw[0]->type))
	{
		IntrusiveList<ExprBase> values;

		for(unsigned i = 0; i < raw.size(); i++)
			values.push_back(raw[i]);

		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);
	}

	IntrusiveList<ExprBase> values;

	TypeBase *subType = NULL;

	for(unsigned i = 0; i < raw.size(); i++)
	{
		ExprBase *value = raw[i];

		if(nestedUnsizedType)
			value = CreateCast(ctx, value->source, value, nestedUnsizedType, false);

		if(subType == NULL)
		{
			subType = value->type;
		}
		else if(subType != value->type)
		{
			// Allow numeric promotion
			if(ctx.IsIntegerType(value->type) && ctx.IsFloatingPointType(subType))
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsIntegerType(value->type) && ctx.IsIntegerType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsFloatingPointType(value->type) && ctx.IsFloatingPointType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(!isType<TypeError>(value->type))
				value = ReportExpected(ctx, value->source, value->type, "ERROR: array element %d type '%.*s' doesn't match '%.*s'", i + 1, FMT_ISTR(value->type->name), FMT_ISTR(subType->name));
		}

		if(value->type == ctx.typeVoid)
			Stop(ctx, value->source, "ERROR: array cannot be constructed from void type elements");

		if(!AssertValueExpression(ctx, value->source, value))
			value = new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

		values.push_back(value);
	}

	if(!values.empty() && isType<TypeError>(values[0]->type))
		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);

	if(TypeClass *typeClass = getType<TypeClass>(subType))
	{
		if(typeClass->hasFinalizer)
			Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(subType->name));
	}

	if(subType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetArrayType(subType, values.size()), values);
}